

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> * __thiscall
tiger::trains::world::World::getTrainsOfPlayer(World *this,Player *player)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  p_Var2 = (this->trainsOfPlayer)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->trainsOfPlayer)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = p_Var1;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (*(Player **)(p_Var2 + 1) >= player) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(Player **)(p_Var2 + 1) < player];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((p_Var3 != p_Var1) && (*(Player **)(p_Var3 + 1) <= player)) {
      p_Var1 = p_Var3;
    }
  }
  return (vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *)
         &p_Var1[1]._M_parent;
}

Assistant:

const std::vector<Train *> &World::getTrainsOfPlayer(const Player *player) const
{
    return trainsOfPlayer.find(player)->second;
}